

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O0

void rotate_dungeons(dw_rom *rom)

{
  dw_map_index local_58 [2];
  dw_map_index to_rotate [15];
  size_t i;
  dw_rom *rom_local;
  
  memcpy(local_58,&DAT_001eadb0,0x3c);
  if ((rom->flags[10] & 0xc) != 0) {
    printf("Rotating and mirroring dungeons...\n");
    for (stack0xffffffffffffffe8 = 0; stack0xffffffffffffffe8 < 0xf;
        register0x00000000 = stack0xffffffffffffffe8 + 1) {
      rotate_mirror_map(rom,local_58[stack0xffffffffffffffe8]);
    }
  }
  return;
}

Assistant:

void rotate_dungeons(dw_rom *rom)
{
    size_t i;
    dw_map_index to_rotate[] = {
//         OVERWORLD,
//         CHARLOCK,
//         HAUKSNESS,
//         TANTEGEL,
//         TANTEGEL_THRONE_ROOM,
//         CHARLOCK_THRONE_ROOM,
//         KOL,
//         BRECCONARY,
//         GARINHAM,
//         CANTLIN,
//         RIMULDAR,
//         TANTEGEL_BASEMENT,
//         NORTHERN_SHRINE,
//         SOUTHERN_SHRINE,

        CHARLOCK_CAVE_1,
        CHARLOCK_CAVE_2,
        CHARLOCK_CAVE_3,
        CHARLOCK_CAVE_4,
        CHARLOCK_CAVE_5,
        CHARLOCK_CAVE_6,
        SWAMP_CAVE,
        MOUNTAIN_CAVE,
        MOUNTAIN_CAVE_2,
        GARINS_GRAVE_1,
        GARINS_GRAVE_2,
        GARINS_GRAVE_3,
        GARINS_GRAVE_4,
        ERDRICKS_CAVE,
        ERDRICKS_CAVE_2,
    };

    if (ROTATE_DUNGEONS(rom)) {
        printf("Rotating and mirroring dungeons...\n");

        for (i=0; i < sizeof(to_rotate) / sizeof(dw_map_index); i++) {
            rotate_mirror_map(rom, to_rotate[i]);
        }
    }
}